

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasn1element.cpp
# Opt level: O2

bool __thiscall QAsn1Element::toBool(QAsn1Element *this,bool *ok)

{
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QAsn1Element QStack_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  fromBool(&QStack_48,true);
  bVar1 = operator==(this,&QStack_48);
  QArrayDataPointer<char>::~QArrayDataPointer(&QStack_48.mValue.d);
  if (bVar1) {
    bVar2 = true;
  }
  else {
    fromBool(&QStack_48,false);
    bVar2 = operator==(this,&QStack_48);
    QArrayDataPointer<char>::~QArrayDataPointer(&QStack_48.mValue.d);
  }
  if (ok != (bool *)0x0) {
    *ok = bVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QAsn1Element::toBool(bool *ok) const
{
    if (*this == fromBool(true)) {
        if (ok)
            *ok = true;
        return true;
    } else if (*this == fromBool(false)) {
        if (ok)
            *ok = true;
        return false;
    } else {
        if (ok)
            *ok = false;
        return false;
    }
}